

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O0

int lwsl_timestamp(int level,char *p,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  int local_94;
  undefined1 local_90 [4];
  int n;
  tm tm;
  tm *ptm;
  timeval tv;
  unsigned_long_long now;
  time_t o_now;
  size_t len_local;
  char *p_local;
  int level_local;
  
  tm.tm_zone = (char *)0x0;
  o_now = len;
  len_local = (size_t)p;
  p_local._0_4_ = level;
  gettimeofday((timeval *)&ptm,(__timezone_ptr_t)0x0);
  now = (unsigned_long_long)ptm;
  tv.tv_usec = (long)ptm * 10000 + (tv.tv_sec / 100 & 0xffffffffU);
  tm.tm_zone = (char *)localtime_r((time_t *)&now,(tm *)local_90);
  *(undefined1 *)len_local = 0;
  local_94 = 0;
  while( true ) {
    if (0xb < local_94) {
      return 0;
    }
    if ((int)p_local == 1 << ((byte)local_94 & 0x1f)) break;
    local_94 = local_94 + 1;
  }
  if ((tm *)tm.tm_zone == (tm *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = tv.tv_usec;
    local_94 = lws_snprintf((char *)len_local,o_now,"[%llu:%04d] %c: ",(ulong)tv.tv_usec / 10000,
                            (ulong)SUB164(auVar1 % ZEXT816(10000),0),
                            (ulong)(uint)(int)log_level_names[local_94]);
  }
  else {
    auVar2._8_4_ = 0;
    auVar2._0_8_ = tv.tv_usec;
    local_94 = lws_snprintf((char *)len_local,o_now,"[%04d/%02d/%02d %02d:%02d:%02d:%04d] %c: ",
                            (ulong)(((tm *)tm.tm_zone)->tm_year + 0x76c),
                            (ulong)(((tm *)tm.tm_zone)->tm_mon + 1),
                            (ulong)(uint)((tm *)tm.tm_zone)->tm_mday,((tm *)tm.tm_zone)->tm_hour,
                            ((tm *)tm.tm_zone)->tm_min,((tm *)tm.tm_zone)->tm_sec,
                            SUB124(auVar2 % ZEXT812(10000),0),(int)log_level_names[local_94]);
  }
  return local_94;
}

Assistant:

int
lwsl_timestamp(int level, char *p, size_t len)
{
#if !defined(LWS_PLAT_OPTEE) && !defined(LWS_WITH_NO_LOGS)
	time_t o_now;
	unsigned long long now;
	struct timeval tv;
	struct tm *ptm = NULL;
#if defined(LWS_HAVE_LOCALTIME_R)
	struct tm tm;
#endif
	int n;

	gettimeofday(&tv, NULL);
	o_now = tv.tv_sec;
	now = ((unsigned long long)tv.tv_sec * 10000) +
				(unsigned int)(tv.tv_usec / 100);

#if defined(LWS_HAVE_LOCALTIME_R)
	ptm = localtime_r(&o_now, &tm);
#else
	ptm = localtime(&o_now);
#endif
	p[0] = '\0';
	for (n = 0; n < LLL_COUNT; n++) {
		if (level != (1 << n))
			continue;

		if (ptm)
			n = lws_snprintf(p, len,
				"[%04d/%02d/%02d %02d:%02d:%02d:%04d] %c: ",
				ptm->tm_year + 1900,
				ptm->tm_mon + 1,
				ptm->tm_mday,
				ptm->tm_hour,
				ptm->tm_min,
				ptm->tm_sec,
				(int)(now % 10000), log_level_names[n]);
		else
			n = lws_snprintf(p, len, "[%llu:%04d] %c: ",
					(unsigned long long) now / 10000,
					(int)(now % 10000), log_level_names[n]);
		return n;
	}
#else
	p[0] = '\0';
#endif

	return 0;
}